

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O3

base_learner * confidence_setup(options_i *options,vw *all)

{
  undefined4 uVar1;
  option_group_definition *this;
  confidence *pcVar2;
  base_learner *l;
  single_learner *__src;
  learner<confidence,_example> *__dest;
  code *pcVar3;
  code *pcVar4;
  bool confidence_after_training;
  bool confidence_arg;
  size_type __dnew_2;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  bool local_39a;
  bool local_399;
  vw *local_398;
  long local_390;
  long *local_388;
  long local_380;
  long local_378 [2];
  option_group_definition local_368;
  string local_330;
  _func_int ***local_310;
  _func_int **local_308;
  _func_int **local_300 [2];
  string local_2f0;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined2 local_2b8;
  undefined1 local_2b6;
  undefined1 local_2b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [112];
  bool local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  typed_option<bool> local_170;
  typed_option<bool> local_d0;
  
  local_399 = false;
  local_39a = false;
  local_2c0 = 0x6e656469666e6f43;
  local_2b8 = 0x6563;
  local_2c8 = 10;
  local_2b6 = 0;
  local_368.m_name._M_dataplus._M_p = (pointer)&local_368.m_name.field_2;
  local_398 = all;
  local_2d0 = &local_2c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_368,&local_2c0);
  local_368.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  local_2f0.field_2._M_allocated_capacity = 0x6e656469666e6f63;
  local_2f0.field_2._8_2_ = 0x6563;
  local_2f0._M_string_length = 10;
  local_2f0.field_2._M_local_buf[10] = '\0';
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_2f0,&local_399);
  local_1a0 = true;
  local_2b0._0_8_ = (_func_int **)0x25;
  local_310 = local_300;
  local_310 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)local_2b0);
  local_300[0] = (_func_int **)local_2b0._0_8_;
  local_310[2] = (_func_int **)0x72616e696220726f;
  local_310[3] = (_func_int **)0x6369646572702079;
  *local_310 = (_func_int **)0x666e6f6320746547;
  local_310[1] = (_func_int **)0x662065636e656469;
  builtin_strncpy((char *)((long)local_310 + 0x1d),"dictions",8);
  local_308 = (_func_int **)local_2b0._0_8_;
  *(char *)((long)local_310 + local_2b0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_210);
  this = VW::config::option_group_definition::add<bool>(&local_368,&local_d0);
  local_388 = (long *)0x19;
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  local_330._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_330,(ulong)&local_388);
  local_330.field_2._M_allocated_capacity = (size_type)local_388;
  builtin_strncpy(local_330._M_dataplus._M_p,"confidence_after_training",0x19);
  local_330._M_string_length = (size_type)local_388;
  local_330._M_dataplus._M_p[(long)local_388] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_330,&local_39a);
  local_390 = 0x19;
  local_388 = local_378;
  local_388 = (long *)std::__cxx11::string::_M_create((ulong *)&local_388,(ulong)&local_390);
  local_378[0] = local_390;
  builtin_strncpy((char *)((long)local_388 + 9),"e after ",8);
  builtin_strncpy((char *)((long)local_388 + 0x11),"training",8);
  *local_388 = 0x6e656469666e6f43;
  local_388[1] = 0x7265746661206563;
  local_380 = local_390;
  *(char *)((long)local_388 + local_390) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_2b0);
  VW::config::option_group_definition::add<bool>(this,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0f0;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  local_2b0._0_8_ = &PTR__typed_option_002cd0f0;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0f0;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_310 != local_300) {
    operator_delete(local_310);
  }
  local_210._0_8_ = &PTR__typed_option_002cd0f0;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_368);
  if (local_399 != false) {
    if (local_398->training != false) {
      pcVar2 = calloc_or_throw<confidence>(1);
      pcVar2->all = local_398;
      pcVar3 = predict_or_learn_with_confidence<true,false>;
      if (local_39a != false) {
        pcVar3 = predict_or_learn_with_confidence<true,true>;
      }
      pcVar4 = predict_or_learn_with_confidence<false,false>;
      if (local_39a != false) {
        pcVar4 = predict_or_learn_with_confidence<false,true>;
      }
      l = setup_base(options,local_398);
      __src = LEARNER::as_singleline<char,char>(l);
      uVar1 = *(undefined4 *)(__src + 0xd0);
      __dest = calloc_or_throw<LEARNER::learner<confidence,example>>(1);
      memcpy(__dest,__src,0xe9);
      *(single_learner **)(__dest + 0x20) = __src;
      *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
      *(confidence **)(__dest + 0xb8) = pcVar2;
      *(single_learner **)(__dest + 0xc0) = __src;
      *(code **)(__dest + 200) = LEARNER::noop;
      *(undefined8 *)(__dest + 0xd8) = 1;
      *(undefined8 *)(__dest + 0xe0) = *(undefined8 *)(__src + 0xe0);
      *(confidence **)(__dest + 0x18) = pcVar2;
      *(code **)(__dest + 0x28) = pcVar3;
      *(code **)(__dest + 0x38) = pcVar3;
      *(code **)(__dest + 0x30) = pcVar4;
      *(undefined8 *)(__dest + 0x40) = 0;
      *(undefined4 *)(__dest + 0xd0) = uVar1;
      __dest[0xe8] = (learner<confidence,_example>)0x0;
      *(confidence **)(__dest + 0x58) = pcVar2;
      *(code **)(__dest + 0x68) = return_confidence_example;
      goto LAB_001c1b78;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Confidence does not work in test mode because learning algorithm state is needed.  Use --save_resume when saving the model and avoid --test_only"
               ,0x90);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  __dest = (learner<confidence,_example> *)0x0;
LAB_001c1b78:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_368.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.m_name._M_dataplus._M_p != &local_368.m_name.field_2) {
    operator_delete(local_368.m_name._M_dataplus._M_p);
  }
  return (base_learner *)__dest;
}

Assistant:

base_learner* confidence_setup(options_i& options, vw& all)
{
  bool confidence_arg = false;
  bool confidence_after_training = false;
  option_group_definition new_options("Confidence");
  new_options.add(make_option("confidence", confidence_arg).keep().help("Get confidence for binary predictions"))
      .add(make_option("confidence_after_training", confidence_after_training).help("Confidence after training"));
  options.add_and_parse(new_options);

  if (!confidence_arg)
    return nullptr;

  if (!all.training)
  {
    cout << "Confidence does not work in test mode because learning algorithm state is needed.  Use --save_resume when "
            "saving the model and avoid --test_only"
         << endl;
    return nullptr;
  }

  auto data = scoped_calloc_or_throw<confidence>();
  data->all = &all;

  void (*learn_with_confidence_ptr)(confidence&, single_learner&, example&) = nullptr;
  void (*predict_with_confidence_ptr)(confidence&, single_learner&, example&) = nullptr;

  if (confidence_after_training)
  {
    learn_with_confidence_ptr = predict_or_learn_with_confidence<true, true>;
    predict_with_confidence_ptr = predict_or_learn_with_confidence<false, true>;
  }
  else
  {
    learn_with_confidence_ptr = predict_or_learn_with_confidence<true, false>;
    predict_with_confidence_ptr = predict_or_learn_with_confidence<false, false>;
  }

  // Create new learner
  learner<confidence, example>& l = init_learner(
      data, as_singleline(setup_base(options, all)), learn_with_confidence_ptr, predict_with_confidence_ptr);

  l.set_finish_example(return_confidence_example);

  return make_base(l);
}